

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

void Gia_ManSetPhasePattern(Gia_Man_t *p,Vec_Int_t *vCiValues)

{
  ulong uVar1;
  uint uVar2;
  Gia_Obj_t *pObj;
  long lVar3;
  long lVar4;
  
  if (p->vCis->nSize != vCiValues->nSize) {
    __assert_fail("Gia_ManCiNum(p) == Vec_IntSize(vCiValues)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                  ,0x186,"void Gia_ManSetPhasePattern(Gia_Man_t *, Vec_Int_t *)");
  }
  if (0 < p->nObjs) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      pObj = (Gia_Obj_t *)(&p->pObjs->field_0x0 + lVar4);
      uVar1 = *(ulong *)pObj;
      if ((~(uint)uVar1 & 0x9fffffff) == 0) {
        uVar2 = (uint)(uVar1 >> 0x20);
        if (vCiValues->nSize <= (int)(uVar2 & 0x1fffffff)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        *(ulong *)pObj =
             uVar1 & 0x7fffffffffffffff | (ulong)(uint)vCiValues->pArray[uVar2 & 0x1fffffff] << 0x3f
        ;
      }
      else {
        Gia_ObjSetPhase(p,pObj);
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0xc;
    } while (lVar3 < p->nObjs);
  }
  return;
}

Assistant:

void Gia_ManSetPhasePattern( Gia_Man_t * p, Vec_Int_t * vCiValues )  
{
    Gia_Obj_t * pObj;
    int i;
    assert( Gia_ManCiNum(p) == Vec_IntSize(vCiValues) );
    Gia_ManForEachObj( p, pObj, i )
        if ( Gia_ObjIsCi(pObj) )
            pObj->fPhase = Vec_IntEntry( vCiValues, Gia_ObjCioId(pObj) );
        else
            Gia_ObjSetPhase( p, pObj );
}